

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentHandlersPostChild.h
# Opt level: O1

error_t ArgumentHandlers::parse_main(int key,char *arg,argp_state *state)

{
  void *pvVar1;
  error_t eVar2;
  long lVar3;
  
  eVar2 = 7;
  if (key == 0x1000003) {
    pvVar1 = state->input;
    eVar2 = 0;
    lVar3 = 0;
    do {
      state->child_inputs[lVar3] = pvVar1;
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
  }
  return eVar2;
}

Assistant:

static error_t
parse_main (int key, char *arg, struct argp_state *state)
{
    struct arguments *theArgumentsStruc = (struct arguments*) state->input;
    switch (key)
    {
        case ARGP_KEY_INIT:
            //give child_parsers access to the arguments structure on 
            //initialization.
            for(unsigned i = 0; i < size(childVector); i++)
                state->child_inputs[i] = theArgumentsStruc;
            break;
        default:
            return ARGP_ERR_UNKNOWN;
    }
    return 0;
}